

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

void Extra_TruthCountOnesInCofs(uint *pTruth,int nVars,short *pStore)

{
  uint uVar1;
  short *psVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  short *psVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar20;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar21 [16];
  uint uVar26;
  uint uVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar33;
  uint uVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  uVar6 = 1 << ((byte)(nVars + -5) & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if (0 < nVars) {
      uVar6 = *pTruth;
      uVar1 = uVar6 >> 1;
      uVar20 = (uVar6 >> 2 & 0x11111111) + (uVar6 & 0x11111111);
      uVar22 = (uVar6 >> 3 & 0x11111111) + (uVar1 & 0x11111111);
      uVar20 = (uVar20 >> 4 & 0x3030303) + (uVar20 & 0x3030303);
      uVar22 = (uVar22 >> 4 & 0x3030303) + (uVar22 & 0x3030303);
      uVar20 = (uVar20 >> 8 & 0x70007) + (uVar20 & 0x70007);
      uVar22 = (uVar22 >> 8 & 0x70007) + (uVar22 & 0x70007);
      auVar17._0_4_ = (uVar20 >> 0x10) + uVar20;
      auVar17._4_4_ = (uVar22 >> 0x10) + uVar22;
      auVar17._8_8_ = 0;
      auVar18 = pshuflw(auVar17,auVar17,0xe8);
      *(int *)pStore = auVar18._0_4_;
      if (nVars != 1) {
        uVar20 = (uVar1 & 0x11111111) + (uVar6 & 0x11111111);
        uVar20 = (uVar20 >> 4 & 0x3030303) + (uVar20 & 0x3030303);
        iVar4 = (uVar20 >> 8 & 0x70007) + (uVar20 & 0x70007);
        pStore[2] = (short)((uint)iVar4 >> 0x10) + (short)iVar4;
        uVar20 = (uVar1 & 0x44444444) + (uVar6 & 0x44444444);
        uVar20 = (uVar20 >> 6 & 0x3030303) + (uVar20 >> 2 & 0x3030303);
        iVar4 = (uVar20 >> 8 & 0x70007) + (uVar20 & 0x70007);
        pStore[3] = (short)((uint)iVar4 >> 0x10) + (short)iVar4;
        if (2 < (uint)nVars) {
          uVar20 = (uVar1 & 0x5050505) + (uVar6 & 0x5050505);
          uVar20 = (uVar20 >> 2 & 0x3030303) + (uVar20 & 0x3030303);
          iVar4 = (uVar20 >> 8 & 0x70007) + (uVar20 & 0x70007);
          pStore[4] = (short)((uint)iVar4 >> 0x10) + (short)iVar4;
          uVar20 = (uVar1 & 0x50505050) + (uVar6 & 0x50505050);
          uVar20 = (uVar20 >> 2 & 0x30303030) + (uVar20 & 0x30303030);
          iVar4 = (uVar20 >> 0xc & 0x70007) + (uVar20 >> 4 & 0x70007);
          pStore[5] = (short)((uint)iVar4 >> 0x10) + (short)iVar4;
          if (nVars != 3) {
            uVar20 = (uVar1 & 0x550055) + (uVar6 & 0x550055);
            uVar20 = (uVar20 >> 2 & 0x330033) + (uVar20 & 0x330033);
            iVar4 = (uVar20 >> 4 & 0x70007) + (uVar20 & 0x70007);
            pStore[6] = (short)((uint)iVar4 >> 0x10) + (short)iVar4;
            uVar20 = (uVar1 & 0x55005500) + (uVar6 & 0x55005500);
            uVar20 = (uVar20 >> 2 & 0x33003300) + (uVar20 & 0x33003300);
            iVar4 = (uVar20 >> 4 & 0x7000700) + (uVar20 & 0x7000700);
            pStore[7] = (ushort)(byte)((uint)iVar4 >> 0x18) + (short)((uint)iVar4 >> 8);
            if (nVars == 5) {
              uVar20 = (uVar1 & 0x5555) + (uVar6 & 0x5555);
              uVar20 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333);
              iVar4 = (uVar20 >> 4 & 0x707) + (uVar20 & 0x707);
              pStore[8] = (short)((uint)iVar4 >> 8) + ((ushort)iVar4 & 0xff);
              uVar6 = (uVar1 & 0x55550000) + (uVar6 & 0x55550000);
              uVar6 = (uVar6 >> 2 & 0x33330000) + (uVar6 & 0x33330000);
              uVar6 = (uVar6 >> 4 & 0x7070000) + (uVar6 & 0x7070000);
              pStore[9] = (short)((uVar6 >> 8) + (uVar6 & 0xf0000) >> 0x10);
            }
          }
        }
      }
    }
  }
  else if (nVars + -5 != 0x1f) {
    uVar3 = 0;
    do {
      uVar1 = (pTruth[uVar3] & 0x55555555) + (pTruth[uVar3] >> 1 & 0x55555555);
      uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
      uVar1 = (uVar1 & 0x7070707) + (uVar1 >> 4 & 0x7070707);
      iVar4 = (uVar1 & 0xf000f) + (uVar1 >> 8 & 0xf000f);
      lVar5 = 0;
      psVar7 = pStore + 10;
      do {
        psVar2 = psVar7 + 1;
        if (((uint)uVar3 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
          psVar2 = psVar7;
        }
        *psVar2 = *psVar2 + (short)((uint)iVar4 >> 0x10) + (short)iVar4;
        psVar7 = psVar7 + 2;
        lVar5 = lVar5 + 1;
      } while ((ulong)(uint)nVars - 5 != lVar5);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar6);
    if (1 < (int)uVar6) {
      sVar8 = *pStore;
      sVar9 = pStore[1];
      sVar10 = pStore[2];
      sVar11 = pStore[3];
      sVar12 = pStore[4];
      sVar13 = pStore[5];
      sVar14 = pStore[6];
      sVar15 = pStore[7];
      sVar16 = pStore[8];
      sVar19 = pStore[9];
      lVar5 = 0;
      do {
        uVar1 = pTruth[lVar5 * 2];
        uVar20 = pTruth[lVar5 * 2 + 1];
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_8_ = 0;
        auVar34._4_4_ = uVar20 >> 2;
        auVar34._0_4_ = uVar20 * 4;
        auVar34._8_8_ = 0;
        auVar35 = auVar34 & _DAT_0086d5a0 | auVar31 & _DAT_0086d590;
        auVar27._4_4_ = uVar1 >> 1;
        auVar27._0_4_ = uVar1;
        auVar27._8_8_ = auVar35._0_8_;
        auVar18._12_4_ = auVar35._4_4_ >> 1;
        auVar18._8_4_ = auVar35._0_4_ >> 1;
        auVar27 = auVar27 & _DAT_008685a0;
        auVar18._4_4_ = uVar20 >> 1;
        auVar18._0_4_ = uVar20;
        auVar18 = auVar18 & _DAT_008685a0;
        uVar22 = auVar18._0_4_ + auVar27._0_4_;
        uVar23 = auVar18._4_4_ + auVar27._4_4_;
        uVar24 = auVar18._8_4_ + auVar27._8_4_;
        uVar25 = auVar18._12_4_ + auVar27._12_4_;
        auVar28._4_4_ = uVar20 >> 4;
        auVar28._0_4_ = uVar20 << 4;
        auVar28._8_8_ = 0;
        auVar18 = auVar28 & _DAT_0086d5c0 | auVar31 & _DAT_0086d5b0;
        auVar29._0_4_ = auVar18._0_4_ >> 1;
        auVar29._4_4_ = auVar18._4_4_ >> 1;
        auVar29._8_4_ = auVar18._8_4_ >> 1;
        auVar29._12_4_ = auVar18._12_4_ >> 1;
        uVar26 = SUB164(auVar29 & _s_UUUUUUUU_0086d5d0,0) + SUB164(auVar18 & _s_UUUUUUUU_0086d5d0,0)
        ;
        uVar30 = SUB164(auVar29 & _s_UUUUUUUU_0086d5d0,4) + SUB164(auVar18 & _s_UUUUUUUU_0086d5d0,4)
        ;
        auVar36._4_4_ = uVar20 >> 8;
        auVar36._0_4_ = uVar20 << 8;
        auVar36._8_8_ = 0;
        auVar18 = auVar36 & _DAT_0086d600 | auVar31 & _DAT_0086d5f0;
        auVar37._0_4_ = auVar18._0_4_ >> 1;
        auVar37._4_4_ = auVar18._4_4_ >> 1;
        auVar37._8_4_ = auVar18._8_4_ >> 1;
        auVar37._12_4_ = auVar18._12_4_ >> 1;
        uVar33 = SUB164(auVar37 & _s_UUUUUUUU_0086d5d0,0) + SUB164(auVar18 & _s_UUUUUUUU_0086d5d0,0)
        ;
        uVar38 = SUB164(auVar37 & _s_UUUUUUUU_0086d5d0,4) + SUB164(auVar18 & _s_UUUUUUUU_0086d5d0,4)
        ;
        uVar22 = (uVar22 >> 2 & 0x33333333) + (uVar22 & 0x33333333);
        uVar23 = (uVar23 >> 2 & 0x33333333) + (uVar23 & 0x33333333);
        uVar24 = (uVar24 >> 2 & 0x33333333) + (uVar24 & 0x33333333);
        uVar25 = (uVar25 >> 2 & 0x33333333) + (uVar25 & 0x33333333);
        uVar26 = (uVar26 >> 2 & 0x33333333) + (uVar26 & 0x33333333);
        uVar30 = (uVar30 >> 2 & 0x33333333) + (uVar30 & 0x33333333);
        uVar33 = (uVar33 >> 2 & 0x33333333) + (uVar33 & 0x33333333);
        uVar38 = (uVar38 >> 2 & 0x33333333) + (uVar38 & 0x33333333);
        uVar26 = (uVar26 >> 4 & 0x7070707) + (uVar26 & 0x7070707);
        uVar30 = (uVar30 >> 4 & 0x7070707) + (uVar30 & 0x7070707);
        uVar33 = (uVar33 >> 4 & 0x7070707) + (uVar33 & 0x7070707);
        uVar38 = (uVar38 >> 4 & 0x7070707) + (uVar38 & 0x7070707);
        uVar22 = (uVar22 >> 4 & 0x7070707) + (uVar22 & 0x7070707);
        uVar23 = (uVar23 >> 4 & 0x7070707) + (uVar23 & 0x7070707);
        uVar24 = (uVar24 >> 4 & 0x7070707) + (uVar24 & 0x7070707);
        uVar25 = (uVar25 >> 4 & 0x7070707) + (uVar25 & 0x7070707);
        uVar26 = (uVar26 >> 8 & 0xf000f) + (uVar26 & 0xf000f);
        uVar30 = (uVar30 >> 8 & 0xf000f) + (uVar30 & 0xf000f);
        uVar33 = (uVar33 >> 8 & 0xf000f) + (uVar33 & 0xf000f);
        uVar38 = (uVar38 >> 8 & 0xf000f) + (uVar38 & 0xf000f);
        uVar22 = (uVar22 >> 8 & 0xf000f) + (uVar22 & 0xf000f);
        uVar23 = (uVar23 >> 8 & 0xf000f) + (uVar23 & 0xf000f);
        uVar24 = (uVar24 >> 8 & 0xf000f) + (uVar24 & 0xf000f);
        uVar25 = (uVar25 >> 8 & 0xf000f) + (uVar25 & 0xf000f);
        auVar32._0_4_ = (uVar22 >> 0x10) + uVar22;
        auVar32._4_4_ = (uVar23 >> 0x10) + uVar23;
        auVar32._8_4_ = (uVar24 >> 0x10) + uVar24;
        auVar32._12_4_ = (uVar25 >> 0x10) + uVar25;
        auVar35._0_4_ = (uVar26 >> 0x10) + uVar26;
        auVar35._4_4_ = (uVar30 >> 0x10) + uVar30;
        auVar35._8_4_ = (uVar33 >> 0x10) + uVar33;
        auVar35._12_4_ = (uVar38 >> 0x10) + uVar38;
        auVar18 = packssdw(auVar32 & _DAT_0086d630,auVar35 & _DAT_0086d630);
        sVar8 = sVar8 + auVar18._0_2_;
        sVar9 = sVar9 + auVar18._2_2_;
        sVar10 = sVar10 + auVar18._4_2_;
        sVar11 = sVar11 + auVar18._6_2_;
        sVar12 = sVar12 + auVar18._8_2_;
        sVar13 = sVar13 + auVar18._10_2_;
        sVar14 = sVar14 + auVar18._12_2_;
        sVar15 = sVar15 + auVar18._14_2_;
        uVar22 = uVar20 << 0x10 | uVar1 & 0xffff;
        uVar22 = (uVar22 >> 1 & 0x55555555) + (uVar22 & 0x55555555);
        uVar1 = uVar20 >> 0x10 | uVar1 & 0xffff0000;
        uVar1 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
        uVar20 = (uVar22 & 0x33333333) + (uVar22 >> 2 & 0x33333333);
        uVar22 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
        uVar1 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
        uVar20 = (uVar22 >> 4 & 0x7070707) + (uVar22 & 0x7070707);
        uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
        uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
        auVar21._0_4_ = (uVar1 >> 0x10) + uVar1;
        auVar21._4_4_ = (uVar20 >> 0x10) + uVar20;
        auVar21._8_8_ = 0;
        auVar18 = pshuflw(auVar21,auVar21,0xe8);
        sVar16 = sVar16 + auVar18._0_2_;
        sVar19 = sVar19 + auVar18._2_2_;
        lVar5 = lVar5 + 1;
      } while ((int)uVar6 / 2 != (int)lVar5);
      *pStore = sVar8;
      pStore[1] = sVar9;
      pStore[2] = sVar10;
      pStore[3] = sVar11;
      pStore[4] = sVar12;
      pStore[5] = sVar13;
      pStore[6] = sVar14;
      pStore[7] = sVar15;
      pStore[8] = sVar16;
      pStore[9] = sVar19;
    }
  }
  return;
}

Assistant:

void Extra_TruthCountOnesInCofs( unsigned * pTruth, int nVars, short * pStore )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(short) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Extra_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Extra_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Extra_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Extra_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Extra_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Extra_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Extra_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Extra_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Extra_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Extra_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Extra_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Extra_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Extra_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Extra_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Extra_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Extra_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Extra_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Extra_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Extra_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Extra_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Extra_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}